

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::
emplace<QHeaderViewPrivate::SectionItem_const&>
          (QPodArrayOps<QHeaderViewPrivate::SectionItem> *this,qsizetype i,SectionItem *args)

{
  long lVar1;
  SectionItem SVar2;
  bool bVar3;
  qsizetype qVar4;
  SectionItem *pSVar5;
  SectionItem *in_RDX;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> *in_RSI;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> *in_RDI;
  long in_FS_OFFSET;
  SectionItem *where;
  GrowthPosition pos;
  bool detach;
  SectionItem tmp;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> *in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::needsDetach(in_RDI);
  uVar7 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd4);
  if (!bVar3) {
    if ((in_RSI == (QArrayDataPointer<QHeaderViewPrivate::SectionItem> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar4 != 0)) {
      pSVar5 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::end(in_RDI);
      *pSVar5 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0085085a;
    }
    if ((in_RSI == (QArrayDataPointer<QHeaderViewPrivate::SectionItem> *)0x0) &&
       (qVar4 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar4 != 0)) {
      pSVar5 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::begin
                         ((QArrayDataPointer<QHeaderViewPrivate::SectionItem> *)0x8507a5);
      pSVar5[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0085085a;
    }
  }
  SVar2 = *in_RDX;
  uVar6 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QHeaderViewPrivate::SectionItem> *)0x0))
  {
    uVar6 = 1;
  }
  QArrayDataPointer<QHeaderViewPrivate::SectionItem>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
             (SectionItem **)in_stack_ffffffffffffffc8,in_RDI);
  pSVar5 = createHole((QPodArrayOps<QHeaderViewPrivate::SectionItem> *)in_RSI,
                      (GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
                      (qsizetype)in_stack_ffffffffffffffc8);
  *pSVar5 = SVar2;
LAB_0085085a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }